

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_llp.c
# Opt level: O0

void gga_k_llp_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_k_llp_params *params;
  
  pvVar2 = malloc(0x10);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x202) {
    *puVar1 = 0x3f718470ead02c36;
    puVar1[1] = 0x4019f1fc9ad2b51c;
  }
  else {
    if (*(int *)*in_RDI != 0x20a) {
      fprintf(_stderr,"Internal error in gga_k_llp\n");
      exit(1);
    }
    *puVar1 = 0x3f70d78ad1fc4845;
    puVar1[1] = 0x40189caf44c46994;
  }
  return;
}

Assistant:

static void
gga_k_llp_init(xc_func_type *p)
{
  gga_k_llp_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_llp_params));
  params = (gga_k_llp_params *) (p->params);

  /* value of beta in standard Becke 88 functional */
  switch(p->info->number){
  case XC_GGA_K_LLP:
    params->beta  = X_FACTOR_C*0.0044188;
    params->gamma = 0.0253/(X_FACTOR_C*0.0044188);
    break;
  case XC_GGA_K_FR_B88:
    params->beta  = X_FACTOR_C*0.004596;
    params->gamma = 0.02774/(X_FACTOR_C*0.004596);
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_llp\n");
    exit(1);
  }
}